

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::OfHelper
              (bool isTypedArrayEntryPoint,Arguments *args,ScriptContext *scriptContext)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this;
  code *pcVar2;
  double value;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  Attributes attributes;
  int succeeded;
  undefined4 *puVar7;
  Var pvVar8;
  RecyclableObject *function;
  JavascriptArray *ptr;
  JavascriptArray *this_00;
  JavascriptCopyOnAccessNativeIntArray *this_01;
  TypedArrayBase *pTVar9;
  RecyclableObject *pRVar10;
  uint64 uVar11;
  uint64 uVar12;
  uint32 length;
  uint32 itemIndex;
  uint uVar13;
  uint32 uVar14;
  anon_class_32_4_7a04c08f_for_newObjectCreationFunction local_b8;
  anon_class_32_4_7a04c08f_for_newObjectCreationFunction local_98;
  JavascriptArray *local_78;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  
  local_70 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_70)->noJsReentrancy;
  ((ThreadContext *)local_70)->noJsReentrancy = true;
  jsReentLock._24_8_ = scriptContext;
  if (((ulong)args->Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x298a,"(args.Info.Count > 0)","args.Info.Count > 0");
    if (!bVar3) goto LAB_00b922b5;
    *puVar7 = 0;
  }
  uVar6 = *(uint *)&args->Info & 0xffffff;
  pvVar8 = Arguments::operator[](args,0);
  bVar3 = JavascriptOperators::IsConstructor(pvVar8);
  length = uVar6 - 1;
  if (bVar3) {
    pvVar8 = Arguments::operator[](args,0);
    function = VarTo<Js::RecyclableObject>(pvVar8);
    pRVar10 = *(RecyclableObject **)(*(long *)(jsReentLock._24_8_ + 8) + 0x30);
    bVar3 = function == pRVar10;
    bVar4 = JavascriptLibrary::IsTypedArrayConstructor(function,(ScriptContext *)jsReentLock._24_8_)
    ;
    *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    this = *(ThreadContext **)(jsReentLock._24_8_ + 0x3b8);
    local_98.scriptContext = (ScriptContext *)jsReentLock._24_8_;
    local_98.constructor = function;
    local_98.len = length;
    local_98.isTypedArrayEntryPoint = isTypedArrayEntryPoint;
    if (function == pRVar10 || bVar4) {
      bVar4 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      ptr = (JavascriptArray *)
            anon_func::anon_class_32_1_2f014396::
            anon_class_32_4_7a04c08f_for_newObjectCreationFunction::operator()(&local_98);
      this->reentrancySafeOrHandled = bVar4;
    }
    else {
      local_b8.scriptContext = (ScriptContext *)jsReentLock._24_8_;
      bVar4 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      local_b8.constructor = function;
      local_b8.len = length;
      local_b8.isTypedArrayEntryPoint = isTypedArrayEntryPoint;
      attributes = FunctionInfo::GetAttributes(function);
      bVar5 = ThreadContext::HasNoSideEffect(this,function,attributes);
      if (bVar5) {
        ptr = (JavascriptArray *)
              anon_func::anon_class_32_1_2f014396::
              anon_class_32_4_7a04c08f_for_newObjectCreationFunction::operator()(&local_b8);
        bVar5 = ThreadContext::IsOnStack(ptr);
LAB_00b91ef4:
        if (bVar5 != false) {
          this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
        }
      }
      else if ((this->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
        if ((attributes & HasNoSideEffect) != None) {
          ptr = (JavascriptArray *)
                anon_func::anon_class_32_1_2f014396::
                anon_class_32_4_7a04c08f_for_newObjectCreationFunction::operator()(&local_b8);
          bVar5 = ThreadContext::IsOnStack(ptr);
          goto LAB_00b91ef4;
        }
        IVar1 = this->implicitCallFlags;
        ptr = (JavascriptArray *)
              anon_func::anon_class_32_1_2f014396::
              anon_class_32_4_7a04c08f_for_newObjectCreationFunction::operator()(&local_b8);
        this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      }
      else {
        this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
        ptr = (JavascriptArray *)
              (((((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                  scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      this->reentrancySafeOrHandled = bVar4;
    }
    JsReentLock::MutateArrayObject((JsReentLock *)local_70);
    *(bool *)((long)local_70 + 0x108) = true;
    bVar4 = IsNonES5Array(ptr);
    if (bVar4) {
      this_00 = UnsafeVarTo<Js::JavascriptArray>(ptr);
    }
    else {
      this_00 = (JavascriptArray *)0x0;
    }
    local_78 = ptr;
    if (this_00 == (JavascriptArray *)0x0) {
      bVar4 = VarIs<Js::TypedArrayBase>(ptr);
      if (bVar4) {
        pTVar9 = UnsafeVarTo<Js::TypedArrayBase>(ptr);
        goto LAB_00b91fe2;
      }
    }
    else {
      bVar4 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(this_00);
      if (bVar4) {
        this_01 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(this_00);
      }
      else {
        this_01 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
      }
      if (this_01 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_01);
      }
      JsReentLock::setObjectForMutation((JsReentLock *)local_70,this_00);
    }
    pTVar9 = (TypedArrayBase *)0x0;
  }
  else {
    if (isTypedArrayEntryPoint) {
      JavascriptError::ThrowTypeError
                ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec40,L"[TypedArray].of");
    }
    this_00 = JavascriptLibrary::CreateArray(*(JavascriptLibrary **)(jsReentLock._24_8_ + 8),length)
    ;
    bVar3 = true;
    if ((this_00->head).ptr == EmptySegment) {
      AllocateHead<void*>(this_00);
    }
    pTVar9 = (TypedArrayBase *)0x0;
    local_78 = this_00;
  }
LAB_00b91fe2:
  if (local_78 == (JavascriptArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x29c8,"(newObj)","newObj");
    if (!bVar4) goto LAB_00b922b5;
    *puVar7 = 0;
  }
  if (bVar3) {
    uVar14 = length;
    itemIndex = 0;
    while (bVar3 = uVar14 != 0, uVar14 = uVar14 - 1, bVar3) {
      pvVar8 = Arguments::operator[](args,itemIndex + 1);
      DirectSetItemAt<void*>(this_00,itemIndex,pvVar8);
      itemIndex = itemIndex + 1;
    }
  }
  else if (pTVar9 == (TypedArrayBase *)0x0) {
    if (length != 0) {
      uVar13 = 1;
      do {
        pvVar8 = Arguments::operator[](args,uVar13);
        *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pRVar10 = VarTo<Js::RecyclableObject>(local_78);
        succeeded = (*(pRVar10->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x29])(pRVar10,(ulong)(uVar13 - 1),pvVar8,4);
        ThrowErrorOnFailure(succeeded,(ScriptContext *)jsReentLock._24_8_,uVar13 - 1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_70);
        *(bool *)((long)local_70 + 0x108) = true;
        uVar13 = uVar13 + 1;
      } while (uVar6 != uVar13);
    }
  }
  else if (length != 0) {
    uVar13 = 1;
    do {
      pvVar8 = Arguments::operator[](args,uVar13);
      *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      (*(pTVar9->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
        super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x70])(pTVar9,(ulong)(uVar13 - 1),pvVar8);
      JsReentLock::MutateArrayObject((JsReentLock *)local_70);
      *(bool *)((long)local_70 + 0x108) = true;
      uVar13 = uVar13 + 1;
    } while (uVar6 != uVar13);
  }
  if (!isTypedArrayEntryPoint) {
    *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    if (uVar6 == 0) {
      value = (double)length;
      uVar11 = NumberUtilities::ToSpecial(value);
      bVar3 = NumberUtilities::IsNan(value);
      if (((bVar3) && (uVar12 = NumberUtilities::ToSpecial(value), uVar12 != 0xfff8000000000000)) &&
         (uVar12 = NumberUtilities::ToSpecial(value), uVar12 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar3) {
LAB_00b922b5:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      pvVar8 = (Var)(uVar11 ^ 0xfffc000000000000);
    }
    else {
      pvVar8 = (Var)((ulong)length | 0x1000000000000);
    }
    JavascriptOperators::OP_SetProperty
              (local_78,0xd1,pvVar8,(ScriptContext *)jsReentLock._24_8_,(PropertyValueInfo *)0x0,
               PropertyOperation_ThrowIfNotExtensible,(Var)0x0);
    JsReentLock::MutateArrayObject((JsReentLock *)local_70);
    *(bool *)((long)local_70 + 0x108) = true;
  }
  *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_78;
}

Assistant:

Var JavascriptArray::OfHelper(bool isTypedArrayEntryPoint, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(args.Info.Count > 0);

        // args.Info.Count cannot equal zero or we would have thrown above so no chance of underflowing
        uint32 len = args.Info.Count - 1;
        Var newObj = nullptr;
        JavascriptArray* newArr = nullptr;
        TypedArrayBase* newTypedArray = nullptr;
        bool isBuiltinArrayCtor = true;

        if (JavascriptOperators::IsConstructor(args[0]))
        {
            RecyclableObject* constructor = VarTo<RecyclableObject>(args[0]);
            isBuiltinArrayCtor = (constructor == scriptContext->GetLibrary()->GetArrayConstructor());
            bool isBuiltInTypedArrayCtor = JavascriptLibrary::IsTypedArrayConstructor(constructor, scriptContext);

            JS_REENTRANT
            (
                jsReentLock,
                newObj = JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isBuiltinArrayCtor || isBuiltInTypedArrayCtor, scriptContext->GetThreadContext(), [=]()->Js::Var
                {
                    Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(len, scriptContext) };
                    Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                    if (isTypedArrayEntryPoint)
                    {
                        return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), len, scriptContext);
                    }
                    else
                    {
                        return JavascriptOperators::NewScObject(constructor, Js::Arguments(constructorCallInfo, constructorArgs), scriptContext);
                    }
                });
            )

            // If the new object we created is an array, remember that as it will save us time setting properties in the object below
            newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            if (newArr)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
                SETOBJECT_FOR_MUTATION(jsReentLock, newArr);

            }
            else if (VarIs<TypedArrayBase>(newObj))
            {
                newTypedArray = UnsafeVarTo<TypedArrayBase>(newObj);
            }
        }
        else
        {
            // We only throw when the constructor property is not a constructor function in the TypedArray version
            if (isTypedArrayEntryPoint)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedFunction, _u("[TypedArray].of"));
            }

            newArr = scriptContext->GetLibrary()->CreateArray(len);
            newArr->EnsureHead<Var>();
            newObj = newArr;
        }

        // At least we have a new object of some kind
        Assert(newObj);

        if (isBuiltinArrayCtor)
        {
            for (uint32 k = 0; k < len; k++)
            {
                Var kValue = args[k + 1];

                newArr->DirectSetItemAt(k, kValue);
            }
        }
        else if (newTypedArray)
        {
            for (uint32 k = 0; k < len; k++)
            {
                Var kValue = args[k + 1];

                JS_REENTRANT(jsReentLock, newTypedArray->DirectSetItem(k, kValue));
            }
        }
        else
        {
            for (uint32 k = 0; k < len; k++)
            {
                Var kValue = args[k + 1];
                JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(VarTo<RecyclableObject>(newObj), k, kValue), scriptContext, k));
            }
        }

        if (!isTypedArrayEntryPoint)
        {
            // Set length if we are in the Array version of the function
            JS_REENTRANT(jsReentLock, JavascriptOperators::OP_SetProperty(newObj, Js::PropertyIds::length, JavascriptNumber::ToVar(len, scriptContext), scriptContext, nullptr, PropertyOperation_ThrowIfNotExtensible));
        }

        return newObj;
    }